

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

void pty_real_select_result(Pty *pty,int fd,int event,int status)

{
  uint uVar1;
  Seat *seat;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  ptrlen data;
  char *local_1040;
  char *message;
  int i;
  int close_on_exit;
  undefined1 local_1028 [2];
  _Bool is_stdout;
  _Bool finished;
  int ret;
  char buf [4096];
  int status_local;
  int event_local;
  int fd_local;
  Pty *pty_local;
  
  bVar8 = false;
  if (event < 0) {
    if (((status & 0x7fU) == 0) || ('\0' < (char)(((byte)status & 0x7f) + 1) >> 1)) {
      pty->child_dead = true;
      del234(ptys_by_pid,pty);
      pty->exit_code = status;
      bVar8 = -1 < pty->master_fd;
    }
  }
  else if (event == 1) {
    bVar7 = fd == pty->master_o;
    sVar3 = read(fd,local_1028,0x1000);
    close_on_exit = (int)sVar3;
    if (((fd == pty->master_fd) && (close_on_exit < 0)) &&
       (piVar4 = __errno_location(), *piVar4 == 5)) {
      close_on_exit = 0;
    }
    if (close_on_exit == 0) {
      uxsel_del(fd);
      close(fd);
      if (pty->master_fd == fd) {
        pty->master_fd = -1;
      }
      if (pty->master_o == fd) {
        pty->master_o = -1;
      }
      if (pty->master_e == fd) {
        pty->master_e = -1;
      }
      if (bVar7) {
        bVar8 = true;
        pty_try_wait();
        if ((pty->child_dead & 1U) == 0) {
          pty->exit_code = 0;
        }
      }
    }
    else {
      if (close_on_exit < 0) {
        perror("read pty master");
        exit(1);
      }
      if (0 < close_on_exit) {
        sVar5 = seat_output(pty->seat,(uint)((bVar7 ^ 0xffU) & 1),local_1028,(long)close_on_exit);
        pty->output_backlog = sVar5;
        pty_uxsel_setup(pty);
      }
    }
  }
  else if (event == 2) {
    pty_try_write(pty);
  }
  if ((bVar8) && ((pty->finished & 1U) == 0)) {
    for (message._0_4_ = 0; (int)message < 3; message._0_4_ = (int)message + 1) {
      if (-1 < pty->fds[(int)message].fd) {
        uxsel_del(pty->fds[(int)message].fd);
      }
    }
    pty_close(pty);
    pty->finished = true;
    iVar2 = conf_get_int(pty->conf,4);
    if ((iVar2 == 1) || ((iVar2 == 2 && (pty->exit_code != 0)))) {
      if ((pty->exit_code & 0x7fU) == 0) {
        local_1040 = dupprintf("\r\n[pterm: process terminated with exit code %d]\r\n",
                               (ulong)(uint)((int)(pty->exit_code & 0xff00U) >> 8));
      }
      else if ((char)(((byte)pty->exit_code & 0x7f) + 1) >> 1 < '\x01') {
        local_1040 = dupprintf("\r\n[pterm: process terminated]\r\n");
      }
      else {
        uVar1 = pty->exit_code;
        pcVar6 = strsignal(pty->exit_code & 0x7f);
        local_1040 = dupprintf("\r\n[pterm: process terminated on signal %d (%s)]\r\n",
                               (ulong)(uVar1 & 0x7f),pcVar6);
      }
      seat = pty->seat;
      data = ptrlen_from_asciz(local_1040);
      seat_stdout_pl(seat,data);
      safefree(local_1040);
    }
    seat_eof(pty->seat);
    seat_notify_remote_exit(pty->seat);
  }
  return;
}

Assistant:

static void pty_real_select_result(Pty *pty, int fd, int event, int status)
{
    char buf[4096];
    int ret;
    bool finished = false;

    if (event < 0) {
        /*
         * We've been called because our child process did
         * something. `status' tells us what.
         */
        if ((WIFEXITED(status) || WIFSIGNALED(status))) {
            /*
             * The primary child process died.
             */
            pty->child_dead = true;
            del234(ptys_by_pid, pty);
            pty->exit_code = status;

            /*
             * If this is an ordinary pty session, this is also the
             * moment to terminate the whole backend.
             *
             * We _could_ instead keep the terminal open for remaining
             * subprocesses to output to, but conventional wisdom
             * seems to feel that that's the Wrong Thing for an
             * xterm-alike, so we bail out now (though we don't
             * necessarily _close_ the window, depending on the state
             * of Close On Exit). This would be easy enough to change
             * or make configurable if necessary.
             */
            if (pty->master_fd >= 0)
                finished = true;
        }
    } else {
        if (event == SELECT_R) {
            bool is_stdout = (fd == pty->master_o);

            ret = read(fd, buf, sizeof(buf));

            /*
             * Treat EIO on a pty master as equivalent to EOF (because
             * that's how the kernel seems to report the event where
             * the last process connected to the other end of the pty
             * went away).
             */
            if (fd == pty->master_fd && ret < 0 && errno == EIO)
                ret = 0;

            if (ret == 0) {
                /*
                 * EOF on this input fd, so to begin with, we may as
                 * well close it, and remove all references to it in
                 * the pty's fd fields.
                 */
                uxsel_del(fd);
                close(fd);
                if (pty->master_fd == fd)
                    pty->master_fd = -1;
                if (pty->master_o == fd)
                    pty->master_o = -1;
                if (pty->master_e == fd)
                    pty->master_e = -1;

                if (is_stdout) {
                    /*
                     * We assume a clean exit if the pty (or stdout
                     * pipe) has closed, but the actual child process
                     * hasn't. The only way I can imagine this
                     * happening is if it detaches itself from the pty
                     * and goes daemonic - in which case the expected
                     * usage model would precisely _not_ be for the
                     * pterm window to hang around!
                     */
                    finished = true;
                    pty_try_wait(); /* one last effort to collect exit code */
                    if (!pty->child_dead)
                        pty->exit_code = 0;
                }
            } else if (ret < 0) {
                perror("read pty master");
                exit(1);
            } else if (ret > 0) {
                pty->output_backlog = seat_output(
                    pty->seat, !is_stdout, buf, ret);
                pty_uxsel_setup(pty);
            }
        } else if (event == SELECT_W) {
            /*
             * Attempt to send data down the pty.
             */
            pty_try_write(pty);
        }
    }

    if (finished && !pty->finished) {
        int close_on_exit;
        int i;

        for (i = 0; i < 3; i++)
            if (pty->fds[i].fd >= 0)
                uxsel_del(pty->fds[i].fd);

        pty_close(pty);

        pty->finished = true;

        /*
         * This is a slight layering-violation sort of hack: only
         * if we're not closing on exit (COE is set to Never, or to
         * Only On Clean and it wasn't a clean exit) do we output a
         * `terminated' message.
         */
        close_on_exit = conf_get_int(pty->conf, CONF_close_on_exit);
        if (close_on_exit == FORCE_OFF ||
            (close_on_exit == AUTO && pty->exit_code != 0)) {
            char *message;
            if (WIFEXITED(pty->exit_code)) {
                message = dupprintf(
                    "\r\n[pterm: process terminated with exit code %d]\r\n",
                    WEXITSTATUS(pty->exit_code));
            } else if (WIFSIGNALED(pty->exit_code)) {
#if !HAVE_STRSIGNAL
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d]\r\n",
                    WTERMSIG(pty->exit_code));
#else
                message = dupprintf(
                    "\r\n[pterm: process terminated on signal %d (%s)]\r\n",
                    WTERMSIG(pty->exit_code),
                    strsignal(WTERMSIG(pty->exit_code)));
#endif
            } else {
                /* _Shouldn't_ happen, but if it does, a vague message
                 * is better than no message at all */
                message = dupprintf("\r\n[pterm: process terminated]\r\n");
            }
            seat_stdout_pl(pty->seat, ptrlen_from_asciz(message));
            sfree(message);
        }

        seat_eof(pty->seat);
        seat_notify_remote_exit(pty->seat);
    }
}